

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::TestSpec::NamePattern::matches(NamePattern *this,TestCaseInfo *testCase)

{
  size_t __n;
  int iVar1;
  long lVar2;
  logic_error *this_00;
  bool bVar3;
  string local_30;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    toLower(&local_30,&testCase->name);
    __n = (this->m_name)._M_string_length;
    if (__n == local_30._M_string_length) {
      if (__n == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp((this->m_name)._M_dataplus._M_p,local_30._M_dataplus._M_p,__n);
        bVar3 = iVar1 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return bVar3;
    }
    goto LAB_001317ec;
  case WildcardAtStart:
    toLower(&local_30,&testCase->name);
    bVar3 = endsWith(&local_30,&this->m_name);
    break;
  case WildcardAtEnd:
    toLower(&local_30,&testCase->name);
    bVar3 = startsWith(&local_30,&this->m_name);
    break;
  case WildcardAtBothEnds:
    toLower(&local_30,&testCase->name);
    lVar2 = std::__cxx11::string::find((char *)&local_30,(ulong)(this->m_name)._M_dataplus._M_p,0);
    bVar3 = lVar2 != -1;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown enum");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
LAB_001317ec:
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

virtual bool matches( TestCaseInfo const& testCase ) const {
                switch( m_wildcard ) {
                    case NoWildcard:
                        return m_name == toLower( testCase.name );
                    case WildcardAtStart:
                        return endsWith( toLower( testCase.name ), m_name );
                    case WildcardAtEnd:
                        return startsWith( toLower( testCase.name ), m_name );
                    case WildcardAtBothEnds:
                        return contains( toLower( testCase.name ), m_name );
                }

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wunreachable-code"
#endif
                throw std::logic_error( "Unknown enum" );
#ifdef __clang__
#pragma clang diagnostic pop
#endif
            }